

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

string * pbrt::normalizeArg(string *str)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  undefined8 in_RSI;
  string *in_RDI;
  uchar c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *ret;
  string *__lhs;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  __lhs = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = local_10;
  local_28._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)__lhs,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_RDI), bVar2) {
    pbVar4 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_28);
    bVar1 = *pbVar4;
    if ((bVar1 != 0x5f) && (bVar1 != 0x2d)) {
      iVar3 = tolower((uint)bVar1);
      std::__cxx11::string::operator+=((string *)in_RDI,(char)iVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  return __lhs;
}

Assistant:

inline std::string normalizeArg(const std::string &str) {
    std::string ret;
    for (unsigned char c : str) {
        if (c != '_' && c != '-')
            ret += std::tolower(c);
    }
    return ret;
}